

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fifteen.cpp
# Opt level: O3

void __thiscall Fifteen::slotGenerateBoard(Fifteen *this)

{
  bool bVar1;
  BoardSize boardSize;
  Result RVar2;
  QString *pQVar3;
  QByteArrayView QVar4;
  QArrayData *local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  QArrayData *local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  boardSize = Panel::checkBoardSize
                        ((this->panel)._M_t.
                         super___uniq_ptr_impl<Panel,_std::default_delete<Panel>_>._M_t.
                         super__Tuple_impl<0UL,_Panel_*,_std::default_delete<Panel>_>.
                         super__Head_base<0UL,_Panel_*,_false>._M_head_impl);
  bVar1 = Panel::checkBoardMode
                    ((this->panel)._M_t.super___uniq_ptr_impl<Panel,_std::default_delete<Panel>_>.
                     _M_t.super__Tuple_impl<0UL,_Panel_*,_std::default_delete<Panel>_>.
                     super__Head_base<0UL,_Panel_*,_false>._M_head_impl,GRAPHIC);
  RVar2 = Controller::generateBoard
                    ((this->controller)._M_t.
                     super___uniq_ptr_impl<Controller,_std::default_delete<Controller>_>._M_t.
                     super__Tuple_impl<0UL,_Controller_*,_std::default_delete<Controller>_>.
                     super__Head_base<0UL,_Controller_*,_false>._M_head_impl,boardSize,(uint)bVar1);
  if (RVar2 != OK) {
    QVar4.m_data = (storage_type *)0x0;
    QVar4.m_size = (qsizetype)&local_38;
    QString::fromUtf8(QVar4);
    local_58 = local_38;
    uStack_50 = uStack_30;
    local_48 = local_28;
    pQVar3 = Message::getMessage(OK);
    QMessageBox::information(this,&local_58,pQVar3,0x400,0);
    if (local_58 != (QArrayData *)0x0) {
      LOCK();
      (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_58,2,8);
      }
    }
    return;
  }
  createTiles(this);
  setTiles(this);
  return;
}

Assistant:

void Fifteen::slotGenerateBoard()
{
    BoardSize boardSize = panel->checkBoardSize();
    BoardMode boardMode = panel->checkBoardMode( BoardMode::GRAPHIC ) ? BoardMode::GRAPHIC : BoardMode::NUMERIC;

    if ( Result result = controller->generateBoard( boardSize, boardMode ); result != Result::OK )
    {
        QMessageBox::information( this, "", Message::getMessage( result ));
        return;
    }
    redrawTiles();
}